

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O2

void handle_first_write(cio_io_stream *io_stream,void *handler_context,cio_write_buffer *buffer,
                       cio_error err,size_t bytes_transferred)

{
  cio_write_buffer *wbh;
  size_t *psVar1;
  ulong uVar2;
  cio_write_buffer *pcVar3;
  cio_write_buffer *pcVar4;
  cio_write_buffer *pcVar5;
  int iVar6;
  code *UNRECOVERED_JUMPTABLE;
  cio_write_buffer *pcVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  cio_write_buffer *pcVar12;
  
  if (err == CIO_SUCCESS) {
    if ((buffer->data).element.length != bytes_transferred) {
      wbh = (cio_write_buffer *)((long)handler_context + 0x50);
      *(cio_write_buffer **)((long)handler_context + 0x58) = wbh;
      *(cio_write_buffer **)((long)handler_context + 0x50) = wbh;
      *(undefined8 *)((long)handler_context + 0x60) = 0;
      *(undefined8 *)((long)handler_context + 0x68) = 0;
      *(cio_write_buffer **)((long)handler_context + 0x48) = buffer;
      do {
        uVar10 = bytes_transferred;
        buffer = buffer->next;
        uVar2 = (buffer->data).element.length;
        bytes_transferred = uVar10 - uVar2;
      } while (uVar2 <= uVar10);
      *(ulong *)((long)handler_context + 0x80) = uVar10 + (buffer->data).head.q_len;
      *(ulong *)((long)handler_context + 0x88) = uVar2 - uVar10;
      cio_write_buffer_queue_head(wbh,(cio_write_buffer *)((long)handler_context + 0x70));
      pcVar3 = *(cio_write_buffer **)((long)handler_context + 0x48);
      if (pcVar3->next != pcVar3) {
        pcVar7 = buffer->next;
        if (pcVar3 == buffer->next) {
          pcVar7 = pcVar3->next;
        }
        pcVar4 = *(cio_write_buffer **)((long)handler_context + 0x58);
        pcVar5 = pcVar3->prev;
        lVar9 = 0;
        lVar11 = 0;
        for (pcVar12 = pcVar7; pcVar12 != pcVar3; pcVar12 = pcVar12->next) {
          lVar9 = lVar9 + (pcVar12->data).element.length;
          lVar11 = lVar11 + 1;
        }
        pcVar12 = pcVar7->prev;
        pcVar12->next = pcVar3;
        pcVar3->prev = pcVar12;
        (pcVar3->data).head.q_len = (pcVar3->data).head.q_len - lVar11;
        psVar1 = &(pcVar3->data).element.length;
        *psVar1 = *psVar1 - lVar9;
        pcVar5->next = wbh;
        *(cio_write_buffer **)((long)handler_context + 0x58) = pcVar5;
        pcVar4->next = pcVar7;
        pcVar7->prev = pcVar4;
        *(long *)((long)handler_context + 0x60) = *(long *)((long)handler_context + 0x60) + lVar11;
        *(long *)((long)handler_context + 0x68) = *(long *)((long)handler_context + 0x68) + lVar9;
      }
      iVar6 = (**(code **)(*handler_context + 8))(io_stream,wbh,handle_write,handler_context);
      if (iVar6 == 0) {
        return;
      }
      (**(code **)((long)handler_context + 0x38))
                (handler_context,*(undefined8 *)((long)handler_context + 0x40),iVar6,
                 *(code **)((long)handler_context + 0x38));
      return;
    }
    UNRECOVERED_JUMPTABLE = *(code **)((long)handler_context + 0x38);
    uVar8 = *(undefined8 *)((long)handler_context + 0x40);
    err = CIO_SUCCESS;
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)((long)handler_context + 0x38);
    uVar8 = *(undefined8 *)((long)handler_context + 0x40);
  }
  (*UNRECOVERED_JUMPTABLE)(handler_context,uVar8,err);
  return;
}

Assistant:

static void handle_first_write(struct cio_io_stream *io_stream, void *handler_context, struct cio_write_buffer *buffer, enum cio_error err, size_t bytes_transferred)
{
	struct cio_buffered_stream *buffered_stream = handler_context;
	if (cio_unlikely(err != CIO_SUCCESS)) {
		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
		return;
	}

	if (cio_likely(bytes_transferred == buffer->data.head.total_length)) {
		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
		return;
	}

	handle_partial_writes(buffered_stream, io_stream, buffer, bytes_transferred);
}